

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch.cc
# Opt level: O0

optional<Patch::Change> * __thiscall
Patch::get_change_starting_before_position<Patch::OldCoordinates>
          (optional<Patch::Change> *__return_storage_ptr__,Patch *this,Point target)

{
  uint uVar1;
  bool bVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  Change local_e0;
  Point local_a0;
  Point new_start;
  Point old_start;
  Point local_70;
  Point local_68;
  Point node_new_start;
  Point node_old_start;
  PositionStackEntry found_node_left_ancestor_info;
  PositionStackEntry left_ancestor_info;
  Node *node;
  Node *found_node;
  Patch *this_local;
  Point target_local;
  
  node = (Node *)0x0;
  left_ancestor_info._16_8_ = this->root;
  this_local = (Patch *)target;
  PositionStackEntry::PositionStackEntry
            ((PositionStackEntry *)&found_node_left_ancestor_info.total_old_text_size);
  PositionStackEntry::PositionStackEntry((PositionStackEntry *)&node_old_start);
  while (left_ancestor_info._16_8_ != 0) {
    node_new_start =
         Point::traverse((Point *)&found_node_left_ancestor_info.total_old_text_size,
                         (Point *)(left_ancestor_info._16_8_ + 0x20));
    local_68 = Point::traverse(&left_ancestor_info.old_end,
                               (Point *)(left_ancestor_info._16_8_ + 0x28));
    local_70 = OldCoordinates::choose(node_new_start,local_68);
    bVar2 = Point::operator<=(&local_70,(Point *)&this_local);
    if (bVar2) {
      node = (Node *)left_ancestor_info._16_8_;
      node_old_start.row = found_node_left_ancestor_info.total_old_text_size;
      node_old_start.column = found_node_left_ancestor_info.total_new_text_size;
      found_node_left_ancestor_info.old_end = left_ancestor_info.old_end;
      found_node_left_ancestor_info.new_end.column = left_ancestor_info.new_end.column;
      found_node_left_ancestor_info.new_end.row = left_ancestor_info.new_end.row;
      if (*(long *)(left_ancestor_info._16_8_ + 8) == 0) break;
      found_node_left_ancestor_info._16_8_ =
           Point::traverse(&node_new_start,(Point *)(left_ancestor_info._16_8_ + 0x10));
      left_ancestor_info.old_end =
           Point::traverse(&local_68,(Point *)(left_ancestor_info._16_8_ + 0x18));
      uVar3 = Node::left_subtree_old_text_size((Node *)left_ancestor_info._16_8_);
      uVar4 = Node::old_text_size((Node *)left_ancestor_info._16_8_);
      left_ancestor_info.new_end.row = uVar3 + uVar4 + left_ancestor_info.new_end.row;
      uVar3 = Node::left_subtree_new_text_size((Node *)left_ancestor_info._16_8_);
      uVar4 = Node::new_text_size((Node *)left_ancestor_info._16_8_);
      left_ancestor_info.new_end.column = uVar3 + uVar4 + left_ancestor_info.new_end.column;
      left_ancestor_info._16_8_ = *(undefined8 *)(left_ancestor_info._16_8_ + 8);
    }
    else {
      if (*(long *)left_ancestor_info._16_8_ == 0) break;
      left_ancestor_info._16_8_ = *(undefined8 *)left_ancestor_info._16_8_;
    }
  }
  if (node == (Node *)0x0) {
    optional<Patch::Change>::optional(__return_storage_ptr__);
  }
  else {
    new_start = Point::traverse(&node_old_start,&node->old_distance_from_left_ancestor);
    local_a0 = Point::traverse(&found_node_left_ancestor_info.old_end,
                               &node->new_distance_from_left_ancestor);
    local_e0.old_start = new_start;
    local_e0.old_end = Point::traverse(&new_start,&node->old_extent);
    local_e0.new_start = local_a0;
    local_e0.new_end = Point::traverse(&local_a0,&node->new_extent);
    local_e0.old_text = std::unique_ptr<Text,_std::default_delete<Text>_>::get(&node->old_text);
    local_e0.new_text = std::unique_ptr<Text,_std::default_delete<Text>_>::get(&node->new_text);
    uVar1 = found_node_left_ancestor_info.new_end.row;
    local_e0.preceding_old_text_size = Node::left_subtree_old_text_size(node);
    local_e0.preceding_old_text_size = uVar1 + local_e0.preceding_old_text_size;
    uVar1 = found_node_left_ancestor_info.new_end.column;
    local_e0.preceding_new_text_size = Node::left_subtree_new_text_size(node);
    local_e0.preceding_new_text_size = uVar1 + local_e0.preceding_new_text_size;
    local_e0.old_text_size = Node::old_text_size(node);
    optional<Patch::Change>::optional(__return_storage_ptr__,&local_e0);
  }
  return __return_storage_ptr__;
}

Assistant:

optional<Patch::Change> Patch::get_change_starting_before_position(Point target) const {
  const Node *found_node = nullptr;
  const Node *node = root;
  Patch::PositionStackEntry left_ancestor_info;
  Patch::PositionStackEntry found_node_left_ancestor_info;

  while (node) {
    Point node_old_start = left_ancestor_info.old_end.traverse(node->old_distance_from_left_ancestor);
    Point node_new_start = left_ancestor_info.new_end.traverse(node->new_distance_from_left_ancestor);
    if (CoordinateSpace::choose(node_old_start, node_new_start) <= target) {
      found_node = node;
      found_node_left_ancestor_info = left_ancestor_info;
      if (node->right) {
        left_ancestor_info.old_end = node_old_start.traverse(node->old_extent);
        left_ancestor_info.new_end = node_new_start.traverse(node->new_extent);
        left_ancestor_info.total_old_text_size += node->left_subtree_old_text_size() + node->old_text_size();
        left_ancestor_info.total_new_text_size += node->left_subtree_new_text_size() + node->new_text_size();
        node = node->right;
      } else {
        break;
      }
    } else {
      if (node->left) {
        node = node->left;
      } else {
        break;
      }
    }
  }

  if (found_node) {
    Point old_start = found_node_left_ancestor_info.old_end.traverse(found_node->old_distance_from_left_ancestor);
    Point new_start = found_node_left_ancestor_info.new_end.traverse(found_node->new_distance_from_left_ancestor);

    return Change{
      old_start, old_start.traverse(found_node->old_extent),
      new_start, new_start.traverse(found_node->new_extent),
      found_node->old_text.get(),
      found_node->new_text.get(),
      found_node_left_ancestor_info.total_old_text_size + found_node->left_subtree_old_text_size(),
      found_node_left_ancestor_info.total_new_text_size + found_node->left_subtree_new_text_size(),
      found_node->old_text_size()
    };
  } else {
    return optional<Change>{};
  }
}